

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O1

void __thiscall PrintLanguage::pushAtom(PrintLanguage *this,Atom *atom)

{
  pointer pRVar1;
  int iVar2;
  pointer pRVar3;
  ulong uVar4;
  
  uVar4 = ((long)(this->nodepend).
                 super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->nodepend).
                 super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((ulong)(long)this->pending <= uVar4 && uVar4 - (long)this->pending != 0) {
    recurse(this);
  }
  pRVar1 = (this->revpol).
           super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->revpol).
      super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
      ._M_impl.super__Vector_impl_data._M_start != pRVar1) {
    emitOp(this,pRVar1 + -1);
    emitAtom(this,atom);
    do {
      pRVar1 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar2 = pRVar1[-1].visited + 1;
      pRVar1[-1].visited = iVar2;
      if (iVar2 != (pRVar1[-1].tok)->stage) {
        return;
      }
      emitOp(this,pRVar1 + -1);
      pRVar1 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar1[-1].paren == true) {
        (*this->emit->_vptr_EmitXml[0x1b])(this->emit,0x29);
      }
      else {
        (*this->emit->_vptr_EmitXml[0x1d])(this->emit,(ulong)(uint)pRVar1[-1].id);
      }
      pRVar1 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar3 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->revpol).
      super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
    } while (pRVar1 != pRVar3);
    return;
  }
  emitAtom(this,atom);
  return;
}

Assistant:

void PrintLanguage::pushAtom(const Atom &atom)

{
  if (pending < nodepend.size()) // pending varnodes before atom
    recurse();			// So we must recurse

  if (revpol.empty())
    emitAtom(atom);
  else {
    emitOp(revpol.back());
    emitAtom(atom);
    do {
      revpol.back().visited += 1;
      if (revpol.back().visited == revpol.back().tok->stage) {
	emitOp(revpol.back());
	if (revpol.back().paren)
	  emit->closeParen(')',revpol.back().id);
	else
	  emit->closeGroup(revpol.back().id);
	revpol.pop_back();
      }
      else
	break;
    } while(!revpol.empty());
  }
}